

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManHasMarks(If_DsdMan_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_24;
  int i;
  If_DsdObj_t *pObj;
  If_DsdMan_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(&p->vObjs);
    if (iVar1 <= local_24) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry(&p->vObjs,local_24);
    if ((*(uint *)((long)pvVar2 + 4) >> 8 & 1) != 0) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int If_DsdManHasMarks( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj;
    int i;
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( pObj->fMark )
            return 1;
    return 0;
}